

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O2

optional<wasm::HeapType> __thiscall
wasm::(anonymous_namespace)::AbstractTypeRefining::optimize(wasm::Module*,wasm::SubTypes_const&)::
AbstractTypeRefiningTypeMapper::getDeclaredSuperType(wasm::HeapType_(void *this,HeapType oldType)

{
  size_type sVar1;
  undefined8 extraout_RDX;
  _Optional_base<wasm::HeapType,_true,_true> _Var2;
  HeapType local_30;
  HeapType oldType_local;
  undefined1 local_20;
  
  local_30.id = oldType.id;
  _Var2._M_payload.super__Optional_payload_base<wasm::HeapType> =
       (_Optional_payload<wasm::HeapType,_true,_true,_true>)
       HeapType::getDeclaredSuperType(&local_30);
  oldType_local.id = _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_20 = _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_engaged;
  while( true ) {
    if (((undefined1  [16])_Var2._M_payload.super__Optional_payload_base<wasm::HeapType> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return (_Optional_base<wasm::HeapType,_true,_true>)
             (_Optional_base<wasm::HeapType,_true,_true>)
             _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>;
    }
    sVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(*(_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      **)((long)this + 0x68),&oldType_local);
    if (sVar1 == 0) break;
    _Var2._M_payload.super__Optional_payload_base<wasm::HeapType> =
         (_Optional_payload<wasm::HeapType,_true,_true,_true>)
         HeapType::getDeclaredSuperType(&oldType_local);
    oldType_local.id = _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_payload;
    local_20 = _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_engaged;
  }
  _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._9_7_ =
       (int7)((ulong)extraout_RDX >> 8);
  _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_20;
  _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
       (HeapType)(HeapType)oldType_local.id;
  return (_Optional_base<wasm::HeapType,_true,_true>)
         (_Optional_base<wasm::HeapType,_true,_true>)
         _Var2._M_payload.super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> getDeclaredSuperType(HeapType oldType) override {
        auto super = oldType.getDeclaredSuperType();

        // Go up the chain of supertypes, skipping things we are mapping away,
        // as those things will not appear in the output. This skips B in the
        // example above.
        while (super && mapping.count(*super)) {
          super = super->getDeclaredSuperType();
        }
        return super;
      }